

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_vostat(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  OBJ_INDEX_DATA *pObjIndex;
  OBJ_DATA *obj;
  char *txt;
  byte bVar2;
  int iVar3;
  char arg1 [4608];
  char buf [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  one_argument(argument,local_2438);
  if (local_2438[0] == '\0') {
    txt = "Syntax: vostat [vnum] or vostat [name]\n\r";
  }
  else {
    bVar1 = is_number(local_2438);
    if (bVar1) {
      atoi(local_2438);
      pObjIndex = get_obj_index(0);
      if (pObjIndex == (OBJ_INDEX_DATA *)0x0) {
        txt = "No object has that vnum.\n\r";
        goto LAB_0027660a;
      }
      bVar2 = 1;
    }
    else {
      bVar2 = 0;
      pObjIndex = (OBJ_INDEX_DATA *)0x0;
    }
    bVar1 = is_number(local_2438);
    if ((!bVar1) && (0 < top_obj_index)) {
      iVar3 = 0;
      do {
        pObjIndex = get_obj_index(0);
        if (pObjIndex != (OBJ_INDEX_DATA *)0x0) {
          bVar1 = is_name(argument,pObjIndex->name);
          if (bVar1) {
            bVar2 = 1;
            break;
          }
          iVar3 = iVar3 + 1;
        }
      } while (iVar3 < top_obj_index);
    }
    if ((bool)(pObjIndex != (OBJ_INDEX_DATA *)0x0 & bVar2)) {
      pObjIndex->limcount = pObjIndex->limcount + -1;
      obj = create_object(pObjIndex,0);
      obj_to_room(obj,ch->in_room);
      strcpy(local_1238,obj->name);
      do_ostat(ch,local_1238);
      extract_obj(obj);
      pObjIndex->limcount = pObjIndex->limcount + 1;
      return;
    }
    txt = "No objects by that name were found.\n\r";
  }
LAB_0027660a:
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_vostat(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg1[MAX_INPUT_LENGTH];
	OBJ_INDEX_DATA *pObjIndex = nullptr;
	OBJ_DATA *obj;
	bool found = false;
	int vnum, nMatch = 0;
	char *blah;
	blah = one_argument(argument, arg1);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax: vostat [vnum] or vostat [name]\n\r", ch);
		return;
	}

	if (is_number(arg1))
	{
		pObjIndex = get_obj_index(atoi(arg1));

		if (pObjIndex == nullptr)
		{
			send_to_char("No object has that vnum.\n\r", ch);
			return;
		}

		found = true;
	}

	if (!is_number(arg1))
	{
		for (vnum = 0; nMatch < top_obj_index; vnum++)
		{
			pObjIndex = get_obj_index(vnum);

			if (pObjIndex != nullptr)
			{
				nMatch++;

				if (is_name(argument, pObjIndex->name))
				{
					found = true;
					break;
				}
			}
		}
	}

	if (!found || !pObjIndex)
	{
		send_to_char("No objects by that name were found.\n\r", ch);
		return;
	}

	pObjIndex->limcount--;

	obj = create_object(pObjIndex, 0);
	obj_to_room(obj, ch->in_room);

	sprintf(buf, "%s", obj->name);
	do_ostat(ch, buf);

	extract_obj(obj);
	pObjIndex->limcount++;
}